

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

void __thiscall QIODevicePrivate::setReadChannelCount(QIODevicePrivate *this,int count)

{
  QVarLengthArray<QRingBuffer,_2LL> *this_00;
  long asize;
  QRingBuffer *pQVar1;
  long sz;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sz = (long)count;
  this_00 = &this->readBuffers;
  asize = (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (asize < sz) {
    if ((this_00->super_QVLABase<QRingBuffer>).super_QVLABaseBase.a < sz) {
      QVLABase<QRingBuffer>::reallocate_impl
                (&this_00->super_QVLABase<QRingBuffer>,2,
                 &(this->readBuffers).super_QVLAStorage<40UL,_8UL,_2LL>,asize,sz);
    }
    if ((this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s < sz) {
      do {
        local_3c = this->readBufferChunkSize;
        if (local_3c == 0) {
          local_3c = 0x4000;
        }
        QVLABase<QRingBuffer>::emplace_back_impl<int>
                  (&this_00->super_QVLABase<QRingBuffer>,2,
                   &(this->readBuffers).super_QVLAStorage<40UL,_8UL,_2LL>,&local_3c);
      } while ((this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s < sz);
    }
  }
  else {
    QVLABase<QRingBuffer>::resize_impl
              (&this_00->super_QVLABase<QRingBuffer>,2,
               &(this->readBuffers).super_QVLAStorage<40UL,_8UL,_2LL>,sz);
  }
  this->readChannelCount = count;
  pQVar1 = (QRingBuffer *)0x0;
  if ((long)this->currentReadChannel <
      (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s) {
    pQVar1 = (QRingBuffer *)
             ((long)this->currentReadChannel * 0x28 +
             (long)(this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr);
  }
  (this->buffer).m_buf = pQVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIODevicePrivate::setReadChannelCount(int count)
{
    if (count > readBuffers.size()) {
        readBuffers.reserve(count);

        // If readBufferChunkSize is zero, we should bypass QIODevice's
        // read buffers, even if the QIODeviceBase::Unbuffered flag is not
        // set when opened. However, if a read transaction is started or
        // ungetChar() is called, we still have to use the internal buffer.
        // To support these cases, pass a default value to the QRingBuffer
        // constructor.

        while (readBuffers.size() < count)
            readBuffers.emplace_back(readBufferChunkSize != 0 ? readBufferChunkSize
                                                              : QIODEVICE_BUFFERSIZE);
    } else {
        readBuffers.resize(count);
    }
    readChannelCount = count;
    setCurrentReadChannel(currentReadChannel);
}